

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanRangeForward100_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTScanTest_scanRangeForward100_Test
          (ARTScanTest_scanRangeForward100_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTScanTest_scanRangeForward100_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTScanTest_scanRangeForward100_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeForward100) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert_key_range(0, 100);
  uint64_t n = 0;
  uint64_t expected = 0;
  const auto fn = [&n, &expected](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    const auto key = decode(v.get_key());
    UNODB_EXPECT_EQ(expected, key);
    expected++;
    return false;
  };
  db.scan_range(0, 100, fn);
  UNODB_EXPECT_EQ(100, n);
}